

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O3

void __thiscall higan::EventLoopThreadPool::Start(EventLoopThreadPool *this)

{
  size_type *psVar1;
  EventLoopThread *pEVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  pointer pcVar7;
  uint __len;
  ulong uVar8;
  undefined1 local_390 [536];
  undefined1 local_178 [16];
  pointer local_168 [30];
  EventLoopThread *local_78;
  vector<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>,std::allocator<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>>>
  *local_70;
  vector<higan::EventLoop*,std::allocator<higan::EventLoop*>> *local_68;
  EventLoopThreadPool *local_60;
  EventLoopThread *local_58;
  size_type *local_50;
  string __str;
  
  if (this->running_ == true) {
    Logger::Logger((Logger *)local_390,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoopThreadPool.cpp"
                   ,0x1e,"Start");
    Fmt::Fmt((Fmt *)local_178,"EventLoopThreadPool %s is running",(this->name_)._M_dataplus._M_p);
    Logger::operator<<((Logger *)local_390,(Fmt *)local_178);
    Logger::~Logger((Logger *)local_390);
  }
  this->running_ = true;
  if (0 < this->thread_num_) {
    local_70 = (vector<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>,std::allocator<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>>>
                *)&this->threads_;
    local_68 = (vector<higan::EventLoop*,std::allocator<higan::EventLoop*>> *)&this->event_loops_;
    uVar8 = 0;
    local_60 = this;
    do {
      local_58 = (EventLoopThread *)operator_new(0x150);
      local_178._0_8_ = local_168;
      pcVar7 = (this->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_178,pcVar7,pcVar7 + (this->name_)._M_string_length);
      std::__cxx11::string::append((char *)local_178);
      __len = 1;
      if (9 < uVar8) {
        uVar3 = 4;
        uVar6 = uVar8;
        do {
          __len = uVar3;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_0010bba5;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_0010bba5;
          }
          if (uVar4 < 10000) goto LAB_0010bba5;
          uVar6 = (uVar6 & 0xffffffff) / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_0010bba5:
      local_50 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,__len,(uint)uVar8);
      pcVar7 = (pointer)0xf;
      if ((pointer *)local_178._0_8_ != local_168) {
        pcVar7 = local_168[0];
      }
      if (pcVar7 < __str._M_dataplus._M_p + local_178._8_8_) {
        pcVar7 = (pointer)0xf;
        if (local_50 != &__str._M_string_length) {
          pcVar7 = (pointer)__str._M_string_length;
        }
        if (pcVar7 < __str._M_dataplus._M_p + local_178._8_8_) goto LAB_0010bc1e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,local_178._0_8_);
      }
      else {
LAB_0010bc1e:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_178,(ulong)local_50);
      }
      pEVar2 = local_58;
      psVar1 = puVar5 + 2;
      if ((size_type *)*puVar5 == psVar1) {
        local_390._16_8_ = *psVar1;
        local_390._24_8_ = puVar5[3];
        local_390._0_8_ = local_390 + 0x10;
      }
      else {
        local_390._16_8_ = *psVar1;
        local_390._0_8_ = (size_type *)*puVar5;
      }
      local_390._8_8_ = puVar5[1];
      *puVar5 = psVar1;
      puVar5[1] = 0;
      *(undefined1 *)psVar1 = 0;
      EventLoopThread::EventLoopThread(local_58,(string *)local_390);
      local_78 = pEVar2;
      std::
      vector<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>,std::allocator<std::unique_ptr<higan::EventLoopThread,std::default_delete<higan::EventLoopThread>>>>
      ::emplace_back<higan::EventLoopThread*>(local_70,&local_78);
      if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
        operator_delete((void *)local_390._0_8_,local_390._16_8_ + 1);
      }
      this = local_60;
      if (local_50 != &__str._M_string_length) {
        operator_delete(local_50,__str._M_string_length + 1);
      }
      if ((pointer *)local_178._0_8_ != local_168) {
        operator_delete((void *)local_178._0_8_,(ulong)(local_168[0] + 1));
      }
      local_390._0_8_ =
           EventLoopThread::GetEventLoop
                     ((EventLoopThread *)
                      (this->threads_).
                      super__Vector_base<std::unique_ptr<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>,_std::allocator<std::unique_ptr<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
                      super___uniq_ptr_impl<higan::EventLoopThread,_std::default_delete<higan::EventLoopThread>_>
                      ._M_t);
      std::vector<higan::EventLoop*,std::allocator<higan::EventLoop*>>::
      emplace_back<higan::EventLoop*>(local_68,(EventLoop **)local_390);
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)this->thread_num_);
  }
  return;
}

Assistant:

void EventLoopThreadPool::Start()
{
	if (running_)
	{
		LOG_FATAL << higan::Fmt("EventLoopThreadPool %s is running", name_.c_str());
	}

	running_ = true;

	for (int i = 0; i < thread_num_; ++i)
	{
		threads_.emplace_back(new EventLoopThread(name_ + "@thread-" + std::to_string(i)));
		event_loops_.push_back(threads_[i]->GetEventLoop());
	}
}